

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

int Wlc_NtkDupOneObject(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int TypeNew,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int Entry;
  int iVar2;
  uint uVar3;
  int i;
  uint uVar4;
  
  uVar1 = *(ushort *)pObj;
  uVar4 = pObj->nFanins;
  i = (int)(((long)pObj - (long)p->pObjs) / 0x18);
  Entry = Vec_IntEntry(&p->vCopies,i);
  *(ushort *)pObj = (ushort)*(undefined4 *)pObj & 0xffc0 | (ushort)TypeNew & 0x3f;
  pObj->nFanins = 0;
  iVar2 = Wlc_ObjDup(pNew,p,i,vFanins);
  *(ushort *)pObj = (ushort)*(undefined4 *)pObj & 0xffc0 | uVar1 & 0x3f;
  pObj->nFanins = uVar4;
  if (TypeNew == 3) {
    uVar3 = pObj->End - pObj->Beg;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    Vec_IntPush(pNew->vInits,~uVar4);
    Vec_IntWriteEntry(&p->vCopies,i,Entry);
  }
  return iVar2;
}

Assistant:

int Wlc_NtkDupOneObject( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int TypeNew, Vec_Int_t * vFanins )
{
    int iObj = Wlc_ObjId(p, pObj);
    unsigned Type = pObj->Type;
    int iObjNew, nFanins = Wlc_ObjFaninNum(pObj);
    int iObjCopy = Wlc_ObjCopy(p, iObj);
    pObj->Type = TypeNew;
    pObj->nFanins = 0;
    iObjNew = Wlc_ObjDup( pNew, p, iObj, vFanins );
    pObj->Type = Type;
    pObj->nFanins = (unsigned)nFanins;
    if ( TypeNew == WLC_OBJ_FO )
    {
        Vec_IntPush( pNew->vInits, -Wlc_ObjRange(pObj) );
        Wlc_ObjSetCopy( p, iObj, iObjCopy );
    }
    return iObjNew;
}